

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O0

void __thiscall fs_tests::create_directories::test_method(create_directories *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  path symlink;
  path dir;
  path tmpfolder;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  path *in_stack_fffffffffffffaf0;
  const_string *in_stack_fffffffffffffb00;
  const_string *msg;
  undefined7 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0f;
  lazy_ostream *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  assertion_result local_3d8 [2];
  const_string local_3a0;
  lazy_ostream local_380 [2];
  assertion_result local_360 [2];
  const_string local_328 [2];
  lazy_ostream local_308 [2];
  assertion_result local_2e8 [2];
  const_string local_2b0 [2];
  lazy_ostream local_290 [2];
  assertion_result local_270 [2];
  const_string local_238 [2];
  lazy_ostream local_218 [2];
  assertion_result local_1f8 [2];
  const_string local_1c0 [2];
  lazy_ostream local_1a0 [2];
  assertion_result local_180 [2];
  const_string local_148 [2];
  lazy_ostream local_128 [2];
  assertion_result local_108 [4];
  path local_a8 [2];
  path local_58 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  fs::path::path((path *)in_stack_fffffffffffffad8,(path *)0x67214d);
  fs::operator/(in_stack_fffffffffffffaf0,
                (char *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
  fs::path::~path((path *)in_stack_fffffffffffffad8);
  std::filesystem::create_directory(local_58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    fs::exists((path *)in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_108,local_128,local_148,0x96,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    std::filesystem::is_directory
              ((path *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_180,local_1a0,local_1c0,0x97,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    fs::create_directories((path *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f8,local_218,local_238,0x98,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  fs::path::path((path *)in_stack_fffffffffffffad8,(path *)0x6725d8);
  fs::operator/(in_stack_fffffffffffffaf0,
                (char *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
  fs::path::~path((path *)in_stack_fffffffffffffad8);
  std::filesystem::create_directory_symlink(local_58,local_a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    fs::exists((path *)in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_270,local_290,local_2b0,0x9c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    std::filesystem::is_symlink
              ((path *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e8,local_308,local_328,0x9d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    in_stack_fffffffffffffb1f =
         std::filesystem::is_directory
                   ((path *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    in_stack_fffffffffffffb10 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_360,local_380,&local_3a0,0x9e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffb0f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffb0f);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
               (const_string *)in_stack_fffffffffffffb10,
               CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),msg);
    fs::create_directories((path *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (bool)in_stack_fffffffffffffae7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffad8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (pointer)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (unsigned_long)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d8,(lazy_ostream *)&stack0xfffffffffffffc08,
               (const_string *)&stack0xfffffffffffffbe8,0x9f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffad8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffaef = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffaef);
  std::filesystem::remove(local_a8);
  std::filesystem::remove(local_58);
  fs::path::~path((path *)in_stack_fffffffffffffad8);
  fs::path::~path((path *)in_stack_fffffffffffffad8);
  fs::path::~path((path *)in_stack_fffffffffffffad8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(create_directories)
{
    // Test fs::create_directories workaround.
    const fs::path tmpfolder{m_args.GetDataDirBase()};

    const fs::path dir{tmpfolder / "a"};
    fs::create_directory(dir);
    BOOST_CHECK(fs::exists(dir));
    BOOST_CHECK(fs::is_directory(dir));
    BOOST_CHECK(!fs::create_directories(dir));

    const fs::path symlink{tmpfolder / "b"};
    fs::create_directory_symlink(dir, symlink);
    BOOST_CHECK(fs::exists(symlink));
    BOOST_CHECK(fs::is_symlink(symlink));
    BOOST_CHECK(fs::is_directory(symlink));
    BOOST_CHECK(!fs::create_directories(symlink));

    fs::remove(symlink);
    fs::remove(dir);
}